

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MessageSetFieldSkipper::SkipMessageSetField
          (MessageSetFieldSkipper *this,CodedInputStream *input,int field_number)

{
  bool bVar1;
  undefined4 in_EDX;
  CodedInputStream *in_RSI;
  CodedInputStream *in_RDI;
  uint32 length;
  int in_stack_0000004c;
  string *in_stack_00000050;
  CodedInputStream *in_stack_00000058;
  undefined8 in_stack_ffffffffffffffd0;
  int count;
  undefined4 in_stack_ffffffffffffffe0;
  CodedInputStream *this_00;
  bool local_1;
  
  count = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  this_00 = in_RDI;
  bVar1 = io::CodedInputStream::ReadVarint32
                    (in_RSI,(uint32 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (bVar1) {
    if (in_RDI->buffer_end_ == (uint8 *)0x0) {
      local_1 = io::CodedInputStream::Skip(in_RDI,count);
    }
    else {
      UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                ((UnknownFieldSet *)this_00,(int)((ulong)in_RSI >> 0x20));
      local_1 = io::CodedInputStream::ReadString
                          (in_stack_00000058,in_stack_00000050,in_stack_0000004c);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MessageSetFieldSkipper::SkipMessageSetField(io::CodedInputStream* input,
                                                 int field_number) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (unknown_fields_ == NULL) {
    return input->Skip(length);
  } else {
    return input->ReadString(unknown_fields_->AddLengthDelimited(field_number),
                             length);
  }
}